

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

char * __thiscall
Assimp::STEP::EXPRESS::ConversionSchema::GetStaticStringForToken
          (ConversionSchema *this,string *token)

{
  bool bVar1;
  char *local_38;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  string *token_local;
  ConversionSchema *this_local;
  
  it._M_node = (_Base_ptr)token;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
       ::find(&this->converters,token);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
       ::end(&this->converters);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_38 = (char *)0x0;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>
    ::operator*(&local_20);
    local_38 = (char *)std::__cxx11::string::c_str();
  }
  return local_38;
}

Assistant:

const char* GetStaticStringForToken(const std::string& token) const {
                ConverterMap::const_iterator it = converters.find(token);
                return it == converters.end() ? nullptr : (*it).first.c_str();
            }